

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotring.cpp
# Opt level: O0

htEntry * __thiscall HotRingInstance::HotRing::search(HotRing *this,string *key)

{
  ulong uVar1;
  __type _Var2;
  bool bVar3;
  size_t sVar4;
  reference pvVar5;
  htEntry *phVar6;
  htEntry *phVar7;
  string *psVar8;
  size_t sVar9;
  ulong __n;
  ulong uVar10;
  bool hotspotAware;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  htEntry compareItem;
  size_t precnt;
  htEntry *res;
  htEntry *nxt;
  htEntry *pre;
  size_t tag;
  size_t index;
  size_t hashValue;
  string *key_local;
  HotRing *this_local;
  
  sVar4 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&hash_fn_abi_cxx11_,key);
  __n = sVar4 & this->hash_mask;
  uVar1 = this->hash_mask;
  uVar10 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar10 = (uVar10 & 0x3333333333333333) + (uVar10 >> 2 & 0x3333333333333333);
  precnt = 0;
  compareItem.next = (htEntry *)this->findcnt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  htEntry::htEntry((htEntry *)local_a0,key,&local_c0,(htEntry *)0x0,
                   (sVar4 & ~uVar1) >>
                   ((byte)((uVar10 + (uVar10 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
                   & 0x3f));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  this->r = this->r + 1;
  pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
           operator[](&this->table,__n);
  hrHead::inc_counter(pvVar5);
  pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
           operator[](&this->table,__n);
  phVar6 = hrHead::get_head(pvVar5);
  if (phVar6 == (htEntry *)0x0) {
    precnt = 0;
  }
  else {
    pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
             operator[](&this->table,__n);
    phVar6 = hrHead::get_head(pvVar5);
    phVar6 = htEntry::get_next(phVar6);
    pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
             operator[](&this->table,__n);
    phVar7 = hrHead::get_head(pvVar5);
    if (phVar6 != phVar7) {
      pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
               operator[](&this->table,__n);
      nxt = hrHead::get_head(pvVar5);
      pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
               operator[](&this->table,__n);
      bVar3 = hrHead::get_active(pvVar5);
      if (bVar3) {
        htEntry::inc_counter(nxt);
      }
      pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
               operator[](&this->table,__n);
      phVar6 = hrHead::get_head(pvVar5);
      res = htEntry::get_next(phVar6);
      do {
        sVar4 = htEntry::get_tag((htEntry *)local_a0);
        sVar9 = htEntry::get_tag(nxt);
        if (sVar4 == sVar9) {
          psVar8 = htEntry::get_key_abi_cxx11_(nxt);
          _Var2 = std::operator==(key,psVar8);
          if (_Var2) {
            precnt = (size_t)nxt;
            if (4 < this->r) {
              pvVar5 = std::
                       vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
                       operator[](&this->table,__n);
              phVar6 = hrHead::get_head(pvVar5);
              if (nxt != phVar6) {
                pvVar5 = std::
                         vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
                         operator[](&this->table,__n);
                bVar3 = hrHead::get_active(pvVar5);
                if (bVar3) {
                  hotspot_movement(this,__n);
                  pvVar5 = std::
                           vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                           ::operator[](&this->table,__n);
                  hrHead::reset_active(pvVar5);
                  pvVar5 = std::
                           vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                           ::operator[](&this->table,__n);
                  hrHead::reset_counter(pvVar5);
                }
                else {
                  pvVar5 = std::
                           vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                           ::operator[](&this->table,__n);
                  hrHead::set_active(pvVar5);
                }
                this->r = 0;
              }
            }
            goto LAB_00103eb1;
          }
        }
        bVar3 = htEntry::operator<(nxt,(htEntry *)local_a0);
        if ((((bVar3) && (bVar3 = htEntry::operator<((htEntry *)local_a0,res), bVar3)) ||
            ((bVar3 = htEntry::operator<((htEntry *)local_a0,res), bVar3 &&
             (bVar3 = htEntry::operator<(res,nxt), bVar3)))) ||
           ((bVar3 = htEntry::operator<(res,nxt), bVar3 &&
            (bVar3 = htEntry::operator<(nxt,(htEntry *)local_a0), bVar3)))) goto LAB_00103eb1;
        res = htEntry::get_next(res);
        nxt = htEntry::get_next(nxt);
        this->findcnt = this->findcnt + 1;
      } while( true );
    }
    pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
             operator[](&this->table,__n);
    phVar6 = hrHead::get_head(pvVar5);
    psVar8 = htEntry::get_key_abi_cxx11_(phVar6);
    _Var2 = std::operator==(psVar8,key);
    if (_Var2) {
      pvVar5 = std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::
               operator[](&this->table,__n);
      precnt = (size_t)hrHead::get_head(pvVar5);
    }
  }
LAB_00103eb1:
  this->findcnt = this->findcnt + 1;
  set_min_max(this,this->findcnt - (long)compareItem.next);
  htEntry::~htEntry((htEntry *)local_a0);
  return (htEntry *)precnt;
}

Assistant:

htEntry* HotRing::search(const string &key){
        size_t hashValue = hash_fn(key);
        size_t index = hashValue & hash_mask;
        size_t tag = (hashValue & (~hash_mask)) >> __builtin_popcountl(hash_mask);

        htEntry* pre = nullptr;
        htEntry* nxt = nullptr;
        htEntry* res = nullptr;

        size_t precnt = findcnt;
        htEntry compareItem(key, "", nullptr, tag);
        bool hotspotAware = false;

        using namespace std;
        //std::cout << key << " : " << index << std::endl; 

        // 在每R个请求完成之后，我们确定是否启动新一轮采样，设置active状态。
        // 如果第R次访问是热访问，则意味着当前热点标识仍然准确，并且无需触发采样
        ++this->r;
        table[index].inc_counter(); // 整个环的访问数加1

        if(table[index].get_head() == nullptr){ // 环中没有元素
            res = nullptr;
        } else if(table[index].get_head()->get_next() == table[index].get_head()){  // 环中有一个元素
            if(table[index].get_head()->get_key() == key){
                res = table[index].get_head();
                if(r >= R){ // 第一个if可能导致加到等于R时没有任何行为，所以这里h和后面需要大于等于R
                    // 只有一个元素，它本身当然就是热点了，所以不需要触发采样
                    r == 0;
                }
            }
        } else {    // 环中有很多元素
            //cout << "第三个if\n";
            pre = table[index].get_head();

            if(table[index].get_active()){ // 3.2.2，active标志存在才进行采样
                pre->inc_counter(); 
            }
            nxt = table[index].get_head()->get_next();
            while (true) {
                if(compareItem.get_tag() == pre->get_tag() && key == pre->get_key()){
                    res = pre;
                    if(r >= R && pre != table[index].get_head()){   // 第R次访问不是热结点，开启采样;当热点调整的时候重置
                        if(table[index].get_active()){  // 保证在设置后的第R次进行热点调整
                            hotspot_movement(index);    // 其中清空了每个数据项的统计信息
                            table[index].reset_active();
                            table[index].reset_counter();
                        } else {
                            table[index].set_active();
                        }
                        r = 0;
                    }
                    break;
                }

                if (((*pre) < (&compareItem) && (compareItem) < (nxt)) ||       //ordre_i-1 < order_k < order_i
                    ((compareItem) < (nxt) && (*nxt) < (pre))     ||            //order_k < order_i < order_i-1 小于有序环最小值
                    ((*nxt) < (pre) && (*pre) < (&compareItem)))                //order_i < order_i-1 < order_k 大于有序环最大值
                {
                    break;
                }
                nxt = nxt->get_next();
                pre = pre->get_next();
                ++findcnt;
            }
        }
        ++findcnt;  // 在正常的循环的地方递增，也就是向上数两行的作用;这一行的作用是查找成功和查找失败的那一个加1，放上面就得写好多个加1

        set_min_max(findcnt - precnt);
        return res;
    }